

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseProtoDecl(Parser *this)

{
  bool bVar1;
  bool bVar2;
  StructDef *pSVar3;
  Namespace *pNVar4;
  CheckedError *ce;
  int t;
  Parser *in_RSI;
  Namespace *pNVar5;
  string id;
  StructDef *struct_def;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  struct_comment;
  string local_48;
  
  bVar1 = IsIdent(in_RSI,"extend");
  bVar2 = IsIdent(in_RSI,"package");
  if (bVar2) {
    ParseNamespace(this);
LAB_00121c8d:
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001220fb;
    CheckedError::~CheckedError((CheckedError *)this);
  }
  else {
    bVar2 = IsIdent(in_RSI,"message");
    t = (int)in_RSI;
    if (bVar2 || bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&struct_comment,&(in_RSI->super_ParserState).doc_comment_);
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        CheckedError::~CheckedError((CheckedError *)this);
        if (bVar1) {
          if ((in_RSI->super_ParserState).token_ == 0x2e) {
            Next(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001220f1;
            CheckedError::~CheckedError((CheckedError *)this);
          }
          std::__cxx11::string::string
                    ((string *)&id,(string *)&(in_RSI->super_ParserState).attribute_);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            ParseNamespacing(this,(string *)in_RSI,&id);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckedError::~CheckedError((CheckedError *)this);
              pSVar3 = LookupCreateStruct(in_RSI,&id,false,false);
              if (pSVar3 == (StructDef *)0x0) {
                std::operator+(&local_48,"cannot extend unknown message type: ",&id);
                Error(this,(string *)in_RSI);
                std::__cxx11::string::~string((string *)&local_48);
                goto LAB_001220e9;
              }
              std::__cxx11::string::~string((string *)&id);
              pNVar5 = (Namespace *)0x0;
              goto LAB_00122049;
            }
          }
LAB_001220e9:
          std::__cxx11::string::~string((string *)&id);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&id,(string *)&(in_RSI->super_ParserState).attribute_);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            StartStruct(this,(string *)in_RSI,(StructDef **)&id);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00121f1e;
            CheckedError::~CheckedError((CheckedError *)this);
            pNVar4 = (Namespace *)operator_new(0x20);
            (pNVar4->components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pNVar4->from_table = 0;
            (pNVar4->components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pNVar4->components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            Namespace::operator=(pNVar4,in_RSI->current_namespace_);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)pNVar4,&id);
            pNVar4->from_table = pNVar4->from_table + 1;
            pNVar5 = in_RSI->current_namespace_;
            pNVar4 = UniqueNamespace(in_RSI,pNVar4);
            in_RSI->current_namespace_ = pNVar4;
            bVar2 = true;
          }
          else {
LAB_00121f1e:
            bVar2 = false;
            pNVar5 = (Namespace *)0x0;
          }
          std::__cxx11::string::~string((string *)&id);
          if (bVar2) {
            pSVar3 = (StructDef *)0x0;
LAB_00122049:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&(pSVar3->super_Definition).doc_comment,&struct_comment);
            ParseProtoFields(this,(StructDef *)in_RSI,SUB81(pSVar3,0),bVar1);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckedError::~CheckedError((CheckedError *)this);
              if (!bVar1) {
                in_RSI->current_namespace_ = pNVar5;
              }
              if ((in_RSI->super_ParserState).token_ == 0x3b) {
                Next(this);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001220f1;
                CheckedError::~CheckedError((CheckedError *)this);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&struct_comment);
              goto LAB_00121ca2;
            }
          }
        }
      }
LAB_001220f1:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&struct_comment);
      goto LAB_001220fb;
    }
    bVar1 = IsIdent(in_RSI,"enum");
    if (!bVar1) {
      bVar1 = IsIdent(in_RSI,"syntax");
      if (bVar1) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001220fb;
        CheckedError::~CheckedError((CheckedError *)this);
        Expect(this,t);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001220fb;
        CheckedError::~CheckedError((CheckedError *)this);
        Expect(this,t);
      }
      else {
        bVar1 = IsIdent(in_RSI,"option");
        if (!bVar1) {
          bVar1 = IsIdent(in_RSI,"service");
          if (!bVar1) {
            TokenToStringId_abi_cxx11_(&local_48,in_RSI,(in_RSI->super_ParserState).token_);
            std::operator+(&id,"don\'t know how to parse .proto declaration starting with ",
                           &local_48);
            Error(this,(string *)in_RSI);
            std::__cxx11::string::~string((string *)&id);
            std::__cxx11::string::~string((string *)&local_48);
            goto LAB_001220fb;
          }
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001220fb;
          CheckedError::~CheckedError((CheckedError *)this);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001220fb;
          CheckedError::~CheckedError((CheckedError *)this);
          ParseProtoCurliesOrIdent(this);
          goto LAB_00121c8d;
        }
        ParseProtoOption(this);
      }
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001220fb;
      CheckedError::~CheckedError((CheckedError *)this);
      Expect(this,t);
      goto LAB_00121c8d;
    }
    ParseEnum(this,SUB81(in_RSI,0),(EnumDef **)0x0,(char *)&id);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001220fb;
    CheckedError::~CheckedError((CheckedError *)this);
    if ((in_RSI->super_ParserState).token_ == 0x3b) {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001220fb;
      CheckedError::~CheckedError((CheckedError *)this);
    }
    EnumDef::RemoveDuplicates((EnumDef *)id._M_dataplus._M_p);
  }
LAB_00121ca2:
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_001220fb:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoDecl() {
  bool isextend = IsIdent("extend");
  if (IsIdent("package")) {
    // These are identical in syntax to FlatBuffer's namespace decl.
    ECHECK(ParseNamespace());
  } else if (IsIdent("message") || isextend) {
    std::vector<std::string> struct_comment = doc_comment_;
    NEXT();
    StructDef *struct_def = nullptr;
    Namespace *parent_namespace = nullptr;
    if (isextend) {
      if (Is('.')) NEXT();  // qualified names may start with a . ?
      auto id = attribute_;
      EXPECT(kTokenIdentifier);
      ECHECK(ParseNamespacing(&id, nullptr));
      struct_def = LookupCreateStruct(id, false);
      if (!struct_def)
        return Error("cannot extend unknown message type: " + id);
    } else {
      std::string name = attribute_;
      EXPECT(kTokenIdentifier);
      ECHECK(StartStruct(name, &struct_def));
      // Since message definitions can be nested, we create a new namespace.
      auto ns = new Namespace();
      // Copy of current namespace.
      *ns = *current_namespace_;
      // But with current message name.
      ns->components.push_back(name);
      ns->from_table++;
      parent_namespace = current_namespace_;
      current_namespace_ = UniqueNamespace(ns);
    }
    struct_def->doc_comment = struct_comment;
    ECHECK(ParseProtoFields(struct_def, isextend, false));
    if (!isextend) { current_namespace_ = parent_namespace; }
    if (Is(';')) NEXT();
  } else if (IsIdent("enum")) {
    // These are almost the same, just with different terminator:
    EnumDef *enum_def;
    ECHECK(ParseEnum(false, &enum_def, nullptr));
    if (Is(';')) NEXT();
    // Temp: remove any duplicates, as .fbs files can't handle them.
    enum_def->RemoveDuplicates();
  } else if (IsIdent("syntax")) {  // Skip these.
    NEXT();
    EXPECT('=');
    EXPECT(kTokenStringConstant);
    EXPECT(';');
  } else if (IsIdent("option")) {  // Skip these.
    ECHECK(ParseProtoOption());
    EXPECT(';');
  } else if (IsIdent("service")) {  // Skip these.
    NEXT();
    EXPECT(kTokenIdentifier);
    ECHECK(ParseProtoCurliesOrIdent());
  } else {
    return Error("don\'t know how to parse .proto declaration starting with " +
                 TokenToStringId(token_));
  }
  return NoError();
}